

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O3

Instr * LinearScan::InsertLea(RegOpnd *dst,Opnd *src,Instr *insertBeforeInstr)

{
  uint uVar1;
  Func *pFVar2;
  uint32 number;
  Instr *pIVar3;
  Instr *this;
  
  this = insertBeforeInstr->m_prev;
  pFVar2 = insertBeforeInstr->m_func->topFunc;
  uVar1 = *(uint *)&pFVar2->field_0x240;
  *(uint *)&pFVar2->field_0x240 = uVar1 | 0x80000;
  pIVar3 = Lowerer::InsertLea(dst,src,insertBeforeInstr);
  while (this = this->m_next, this != insertBeforeInstr) {
    number = IR::Instr::GetNumber(insertBeforeInstr);
    IR::Instr::SetNumber(this,number);
  }
  *(uint *)&pFVar2->field_0x240 = *(uint *)&pFVar2->field_0x240 & 0xfff7ffff | uVar1 & 0x80000;
  return pIVar3;
}

Assistant:

IR::Instr* LinearScan::InsertLea(IR::RegOpnd *dst, IR::Opnd *src, IR::Instr *const insertBeforeInstr)
{
    IR::Instr *instrPrev = insertBeforeInstr->m_prev;

    AutoRestoreLegalize restore(insertBeforeInstr->m_func, true);
    IR::Instr *instrRet = Lowerer::InsertLea(dst, src, insertBeforeInstr);

    for (IR::Instr *instr = instrPrev->m_next; instr != insertBeforeInstr; instr = instr->m_next)
    {
        instr->CopyNumber(insertBeforeInstr);
    }

    return instrRet;
}